

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128.c
# Opt level: O3

void ascon_aead128_assoc_data_update
               (ascon_aead_ctx_t *ctx,uint8_t *assoc_data,size_t assoc_data_len)

{
  if (assoc_data_len != 0) {
    (ctx->bufstate).flow_state = '\x04';
    buffered_accumulation
              (&ctx->bufstate,(uint8_t *)0x0,assoc_data,absorb_assoc_data,assoc_data_len,'\b');
    return;
  }
  return;
}

Assistant:

ASCON_API void
ascon_aead128_assoc_data_update(ascon_aead_ctx_t* const ctx,
                                const uint8_t* assoc_data,
                                size_t assoc_data_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(assoc_data_len == 0 || assoc_data != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_ASSOC_DATA_UPDATED);
    if (assoc_data_len > 0)
    {
        ctx->bufstate.flow_state = ASCON_FLOW_AEAD128_80pq_ASSOC_DATA_UPDATED;
        buffered_accumulation(&ctx->bufstate, NULL, assoc_data,
                              absorb_assoc_data, assoc_data_len, ASCON_RATE);
    }
}